

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O1

void __thiscall QFactoryLoader::~QFactoryLoader(QFactoryLoader *this)

{
  QList<QObject_*(*)()> *this_00;
  pointer puVar1;
  __uniq_ptr_impl<QLibraryPrivate,_QLibraryPrivate::Deleter> _Var2;
  long lVar3;
  Type *this_01;
  Type *pTVar4;
  iterator iVar5;
  iterator iVar6;
  QObject *pQVar7;
  long *plVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  QDeadlineTimer timeout;
  QFactoryLoader *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (-2 < (char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>::guard
                 ._q_value.super___atomic_base<signed_char>._M_i) {
    this_01 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
              ::operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
                            *)this);
    timeout.t2 = 0;
    timeout.type = 1;
    timeout.t1 = 0x7fffffffffffffff;
    pTVar4 = this_01;
    QRecursiveMutex::tryLock(&this_01->mutex,timeout);
    pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
             ::operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
                           *)pTVar4);
    local_28 = this;
    QtPrivate::sequential_erase_one<QList<QFactoryLoader*>,QFactoryLoader*>
              (&pTVar4->loaders,&local_28);
    QRecursiveMutex::unlock(&this_01->mutex);
  }
  if ((this->d).loadedLibraries.d.size != 0) {
    uVar9 = 0;
    do {
      if ((this->d).loadedLibraries.d.ptr[uVar9] == true) {
        puVar1 = (this->d).libraries.
                 super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->d).libraries.
                          super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= uVar9)
        {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar9);
          }
          goto LAB_002d81aa;
        }
        _Var2._M_t.super__Tuple_impl<0UL,_QLibraryPrivate_*,_QLibraryPrivate::Deleter>.
        super__Head_base<0UL,_QLibraryPrivate_*,_false>._M_head_impl =
             puVar1[uVar9]._M_t.super___uniq_ptr_impl<QLibraryPrivate,_QLibraryPrivate::Deleter>.
             _M_t;
        lVar3 = *(long *)((long)_Var2._M_t.
                                super__Tuple_impl<0UL,_QLibraryPrivate_*,_QLibraryPrivate::Deleter>.
                                super__Head_base<0UL,_QLibraryPrivate_*,_false>._M_head_impl + 0x48)
        ;
        if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
          plVar8 = (long *)0x0;
        }
        else {
          plVar8 = *(long **)((long)_Var2._M_t.
                                    super__Tuple_impl<0UL,_QLibraryPrivate_*,_QLibraryPrivate::Deleter>
                                    .super__Head_base<0UL,_QLibraryPrivate_*,_false>._M_head_impl +
                             0x50);
        }
        if (plVar8 != (long *)0x0) {
          (**(code **)(*plVar8 + 0x20))();
        }
        QLibraryPrivate::unload
                  ((QLibraryPrivate *)
                   puVar1[uVar9]._M_t.
                   super___uniq_ptr_impl<QLibraryPrivate,_QLibraryPrivate::Deleter>._M_t,UnloadSys);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)(this->d).loadedLibraries.d.size);
  }
  this_00 = &(this->d).usedStaticInstances;
  iVar5 = QList<QObject_*(*)()>::begin(this_00);
  iVar6 = QList<QObject_*(*)()>::end(this_00);
  for (; iVar5.i != iVar6.i; iVar5.i = iVar5.i + 1) {
    if (*iVar5.i != (_func_QObject_ptr *)0x0) {
      pQVar7 = (**iVar5.i)();
      if (pQVar7 != (QObject *)0x0) {
        (*pQVar7->_vptr_QObject[4])(pQVar7);
      }
    }
  }
  Private::~Private(&this->d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_002d81aa:
  __stack_chk_fail();
}

Assistant:

QFactoryLoader::~QFactoryLoader()
{
    if (!qt_factoryloader_global.isDestroyed()) {
        QMutexLocker locker(&qt_factoryloader_global->mutex);
        qt_factoryloader_global->loaders.removeOne(this);
    }

#if QT_CONFIG(library)
    for (qsizetype i = 0; i < d->loadedLibraries.size(); ++i) {
        if (d->loadedLibraries.at(i)) {
            auto &plugin = d->libraries.at(i);
            delete plugin->inst.data();
            plugin->unload();
        }
    }
#endif

    for (QtPluginInstanceFunction staticInstance : d->usedStaticInstances) {
        if (staticInstance)
            delete staticInstance();
    }
}